

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O2

void density_tests::heterogeneous_queue_basic_polymorphic_base_tests(void)

{
  int iVar1;
  bool bVar2;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue;
  reentrant_consume_operation local_d8;
  consume_operation local_c8;
  reentrant_consume_operation local_b8;
  consume_operation local_a8;
  reentrant_consume_operation local_98;
  consume_operation local_88;
  reentrant_consume_operation local_78;
  consume_operation local_68;
  reentrant_consume_operation local_58;
  consume_operation local_48;
  iterator __begin1;
  
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  __begin1.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  __begin1.m_value.m_pair.m_type.m_feature_table =
       (runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
        )(tuple_type *)0x0;
  __begin1.m_control = (ControlBlock *)0x0;
  __begin1.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  PolymorphicBase::PolymorphicBase((PolymorphicBase *)&__begin1);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
  ::emplace<density_tests::PolymorphicBase,density_tests::PolymorphicBase>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
              *)&queue,(PolymorphicBase *)&__begin1);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)&__begin1);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_emplace<density_tests::SingleDerived>(&queue);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::emplace<density_tests::Derived1>(&queue);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_emplace<density_tests::Derived2>(&queue);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::emplace<density_tests::MultipleDerived>(&queue);
  dynamic_push_3<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&queue);
  dynamic_push_3<density_tests::SingleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&queue);
  dynamic_push_3<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&queue);
  dynamic_push_3<density_tests::Derived2,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&queue);
  dynamic_push_3<density_tests::MultipleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&queue);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::begin(&__begin1,&queue);
  iVar1 = 0x14;
  while (__begin1.m_control != (ControlBlock *)0x0) {
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::iterator::operator++(&__begin1);
    iVar1 = iVar1 + -1;
  }
  if (iVar1 != 0) {
    detail::assert_failed<>
              ("elements == put_count",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0xbb);
  }
  local_48.m_control =
       density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
       ::start_consume_impl(&queue);
  local_48.m_queue = &queue;
  polymorphic_consume<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&local_48);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_48);
  local_58.m_control =
       density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
       ::start_consume_impl(&queue);
  local_58.m_queue = &queue;
  polymorphic_consume<density_tests::SingleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
            (&local_58);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_58);
  local_68.m_control =
       density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
       ::start_consume_impl(&queue);
  local_68.m_queue = &queue;
  polymorphic_consume<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&local_68);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_68);
  local_78.m_control =
       density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
       ::start_consume_impl(&queue);
  local_78.m_queue = &queue;
  polymorphic_consume<density_tests::Derived2,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
            (&local_78);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_78);
  local_88.m_control =
       density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
       ::start_consume_impl(&queue);
  local_88.m_queue = &queue;
  polymorphic_consume<density_tests::MultipleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&local_88);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_88);
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_98.m_control =
         density::
         heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
         ::start_consume_impl(&queue);
    local_98.m_queue = &queue;
    polymorphic_consume<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
              (&local_98);
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_98);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_a8.m_control =
         density::
         heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
         ::start_consume_impl(&queue);
    local_a8.m_queue = &queue;
    polymorphic_consume<density_tests::SingleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
              (&local_a8);
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::~consume_operation(&local_a8);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_b8.m_control =
         density::
         heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
         ::start_consume_impl(&queue);
    local_b8.m_queue = &queue;
    polymorphic_consume<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
              (&local_b8);
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_b8);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_c8.m_control =
         density::
         heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
         ::start_consume_impl(&queue);
    local_c8.m_queue = &queue;
    polymorphic_consume<density_tests::Derived2,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
              (&local_c8);
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::~consume_operation(&local_c8);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_d8.m_control =
         density::
         heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
         ::start_consume_impl(&queue);
    local_d8.m_queue = &queue;
    polymorphic_consume<density_tests::MultipleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
              (&local_d8);
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_d8);
  }
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
          ::empty(&queue);
  if (!bVar2) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0xce);
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy(&queue);
  return;
}

Assistant:

void heterogeneous_queue_basic_polymorphic_base_tests()
    {
        using namespace density;
        using RunTimeType = runtime_type<
          f_default_construct,
          f_move_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment>;
        heter_queue<RunTimeType> queue;

        queue.push(PolymorphicBase());
        queue.reentrant_emplace<SingleDerived>();
        queue.emplace<Derived1>();
        queue.reentrant_emplace<Derived2>();
        queue.emplace<MultipleDerived>();

        dynamic_push_3<PolymorphicBase>(queue);
        dynamic_push_3<SingleDerived>(queue);
        dynamic_push_3<Derived1>(queue);
        dynamic_push_3<Derived2>(queue);
        dynamic_push_3<MultipleDerived>(queue);

        int const put_count = 5 * 4;

        int elements = 0;
        for (const auto & val : queue)
        {
            (void)val;
            elements++;
        }
        DENSITY_TEST_ASSERT(elements == put_count);

        polymorphic_consume<PolymorphicBase>(queue.try_start_consume());
        polymorphic_consume<SingleDerived>(queue.try_start_reentrant_consume());
        polymorphic_consume<Derived1>(queue.try_start_consume());
        polymorphic_consume<Derived2>(queue.try_start_reentrant_consume());
        polymorphic_consume<MultipleDerived>(queue.try_start_consume());

        for (int i = 0; i < 3; i++)
            polymorphic_consume<PolymorphicBase>(queue.try_start_reentrant_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<SingleDerived>(queue.try_start_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<Derived1>(queue.try_start_reentrant_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<Derived2>(queue.try_start_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<MultipleDerived>(queue.try_start_reentrant_consume());

        DENSITY_TEST_ASSERT(queue.empty());
    }